

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O3

void redit(CHAR_DATA *ch,char *argument)

{
  ROOM_INDEX_DATA *pRVar1;
  AREA_DATA_conflict *pAVar2;
  DESCRIPTOR_DATA *pDVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  olc_cmd_type *poVar14;
  double dVar15;
  double dVar16;
  char command [4608];
  char arg [4608];
  undefined4 local_2438;
  ushort local_2434;
  char local_1238 [4616];
  
  pRVar1 = ch->in_room;
  pAVar2 = pRVar1->area;
  smash_tilde(argument);
  strcpy(local_1238,argument);
  pcVar8 = one_argument(argument,(char *)&local_2438);
  bVar6 = is_switched(ch);
  if (bVar6) {
LAB_00353bbb:
    send_to_char("REdit:  Insufficient security to modify room.\n\r",ch);
  }
  else {
    if (ch->pcdata->security <= pAVar2->security) {
      pcVar10 = pAVar2->builders;
      pcVar9 = strstr(pcVar10,ch->name);
      if ((pcVar9 == (char *)0x0) && (pcVar10 = strstr(pcVar10,"All"), pcVar10 == (char *)0x0))
      goto LAB_00353bbb;
    }
    bVar6 = str_cmp((char *)&local_2438,"done");
    if ((bVar6) && (bVar6 = str_cmp((char *)&local_2438,"quit"), bVar6)) {
      bVar6 = is_switched(ch);
      if (bVar6) {
LAB_00353c4c:
        interpret(ch,local_1238);
        return;
      }
      if (ch->pcdata->security <= pAVar2->security) {
        pcVar10 = pAVar2->builders;
        pcVar9 = strstr(pcVar10,ch->name);
        if ((pcVar9 == (char *)0x0) && (pcVar10 = strstr(pcVar10,"All"), pcVar10 == (char *)0x0))
        goto LAB_00353c4c;
      }
      bVar6 = str_cmp((char *)&local_2438,"");
      if (!bVar6) {
        redit_show(ch,"");
        return;
      }
      iVar7 = flag_value(room_flags,(char *)&local_2438);
      if (iVar7 == -99) {
        iVar7 = flag_value(sector_flags,(char *)&local_2438);
        if (iVar7 == -99) {
          bVar6 = str_prefix((char *)&local_2438,"north");
          if (!bVar6) {
            local_2434 = 0x68;
            local_2438 = 0x74726f6e;
          }
          bVar6 = str_prefix((char *)&local_2438,"south");
          if (!bVar6) {
            local_2434 = 0x68;
            local_2438 = 0x74756f73;
          }
          bVar6 = str_prefix((char *)&local_2438,"east");
          if (!bVar6) {
            local_2434 = local_2434 & 0xff00;
            local_2438 = 0x74736165;
          }
          bVar6 = str_prefix((char *)&local_2438,"west");
          if (!bVar6) {
            local_2434 = local_2434 & 0xff00;
            local_2438 = 0x74736577;
          }
          bVar6 = str_prefix((char *)&local_2438,"up");
          if (!bVar6) {
            uVar4 = (uint)local_2438 >> 0x10;
            local_2438 = CONCAT22((ushort)uVar4 & 0xff00,0x7075);
          }
          bVar6 = str_prefix((char *)&local_2438,"down");
          if (!bVar6) {
            local_2434 = local_2434 & 0xff00;
            local_2438 = 0x6e776f64;
          }
          bVar6 = str_prefix((char *)&local_2438,"commands");
          if (bVar6) {
            lVar5 = 0;
            do {
              lVar13 = lVar5;
              if (lVar13 + 0x10 == 0x1f0) goto LAB_00353c4c;
              bVar6 = str_prefix((char *)&local_2438,*(char **)((long)&redit_table[1].name + lVar13)
                                );
              lVar5 = lVar13 + 0x10;
            } while (bVar6);
            poVar14 = (olc_cmd_type *)((long)&redit_table[1].name + lVar13);
          }
          else {
            poVar14 = redit_table;
          }
          bVar6 = (*poVar14->olc_fun)(ch,pcVar8);
          if (!bVar6) {
            return;
          }
          *(byte *)pAVar2->area_flags = (byte)pAVar2->area_flags[0] | 8;
          return;
        }
        pRVar1->sector_type = (short)iVar7;
        *(byte *)pAVar2->area_flags = (byte)pAVar2->area_flags[0] | 8;
        pcVar8 = "Sector type set.\n\r";
      }
      else {
        iVar12 = iVar7 + 0x1f;
        if (-1 < iVar7) {
          iVar12 = iVar7;
        }
        iVar12 = iVar12 >> 5;
        uVar11 = pRVar1->room_flags[iVar12];
        dVar15 = ldexp(1.0,iVar7 % 0x20);
        dVar16 = ldexp(1.0,iVar7 % 0x20);
        if ((uVar11 & (long)dVar15) == 0) {
          uVar11 = (long)dVar16 | pRVar1->room_flags[iVar12];
        }
        else {
          uVar11 = ~(long)dVar16 & pRVar1->room_flags[iVar12];
        }
        pRVar1->room_flags[iVar12] = uVar11;
        *(byte *)pAVar2->area_flags = (byte)pAVar2->area_flags[0] | 8;
        pcVar8 = "Room flag toggled.\n\r";
      }
      goto LAB_00353c81;
    }
  }
  pDVar3 = ch->desc;
  pDVar3->pEdit = (void *)0x0;
  pDVar3->editor = 0;
  pcVar8 = "Exiting Riftshadow OLC...\n\r";
LAB_00353c81:
  send_to_char(pcVar8,ch);
  return;
}

Assistant:

void redit(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	AREA_DATA *pArea;
	char arg[MAX_STRING_LENGTH];
	char command[MAX_INPUT_LENGTH];
	int cmd;
	int value;

	EDIT_ROOM(ch, pRoom);
	pArea = pRoom->area;

	smash_tilde(argument);
	strcpy(arg, argument);
	argument = one_argument(argument, command);

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("REdit:  Insufficient security to modify room.\n\r", ch);
		edit_done(ch);
		return;
	}

	if (!str_cmp(command, "done") || !str_cmp(command, "quit"))
	{
		edit_done(ch);
		return;
	}

	if (!IS_BUILDER(ch, pArea))
		return interpret(ch, arg);

	if (!str_cmp(command, ""))
	{
		redit_show(ch, "");
		return;
	}

	if ((value = flag_value(room_flags, command)) != NO_FLAG)
	{
		TOGGLE_BIT(pRoom->room_flags, value);

		SET_BIT(pArea->area_flags, AREA_CHANGED);
		send_to_char("Room flag toggled.\n\r", ch);
		return;
	}

	if ((value = flag_value(sector_flags, command)) != NO_FLAG)
	{
		pRoom->sector_type = value;

		SET_BIT(pArea->area_flags, AREA_CHANGED);
		send_to_char("Sector type set.\n\r", ch);
		return;
	}

	/* Check for moment */
	if (!str_prefix(command, "north"))
		sprintf(command, "north");

	if (!str_prefix(command, "south"))
		sprintf(command, "south");

	if (!str_prefix(command, "east"))
		sprintf(command, "east");

	if (!str_prefix(command, "west"))
		sprintf(command, "west");

	if (!str_prefix(command, "up"))
		sprintf(command, "up");

	if (!str_prefix(command, "down"))
		sprintf(command, "down");

	/* Search Table and Dispatch Command. */
	for (cmd = 0; redit_table[cmd].name != nullptr; cmd++)
	{
		if (!str_prefix(command, redit_table[cmd].name))
		{
			if ((*redit_table[cmd].olc_fun)(ch, argument))
				SET_BIT(pArea->area_flags, AREA_CHANGED);

			return;
		}
	}

	/* Default to Standard Interpreter. */
	interpret(ch, arg);
}